

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::onAttach(Assembler *this,CodeHolder *code)

{
  _func_int *p_Var1;
  Error EVar2;
  CodeHolder *in_RSI;
  CodeEmitter *in_RDI;
  uint8_t *p;
  char *in_stack_00000300;
  int in_stack_0000030c;
  char *in_stack_00000310;
  
  if ((in_RSI->_sections).super_ZoneVectorBase._length == 0) {
    DebugUtils::assertionFailed(in_stack_00000310,in_stack_0000030c,in_stack_00000300);
  }
  in_RDI[1]._vptr_CodeEmitter = *(in_RSI->_sections).super_ZoneVectorBase._data;
  p_Var1 = in_RDI[1]._vptr_CodeEmitter[7];
  *(_func_int **)&in_RDI[1]._codeInfo = p_Var1;
  in_RDI[1]._codeInfo._baseAddress = (uint64_t)(p_Var1 + (long)in_RDI[1]._vptr_CodeEmitter[9]);
  in_RDI[1]._code = (CodeHolder *)(p_Var1 + (long)in_RDI[1]._vptr_CodeEmitter[8]);
  in_RDI[1]._nextEmitter = (CodeEmitter *)0x0;
  in_RDI[1]._type = '\0';
  in_RDI[1]._destroyed = '\0';
  in_RDI[1]._finalized = '\0';
  in_RDI[1]._reserved = '\0';
  in_RDI[1]._lastError = 0;
  in_RDI[1]._privateData = 0;
  in_RDI[1]._globalHints = 0;
  in_RDI[1]._globalOptions = 0;
  in_RDI[1]._options = 0;
  EVar2 = CodeEmitter::onAttach(in_RDI,in_RSI);
  return EVar2;
}

Assistant:

Error Assembler::onAttach(CodeHolder* code) noexcept {
  // Attach to the end of the .text section.
  _section = code->_sections[0];
  uint8_t* p = _section->_buffer._data;

  _bufferData = p;
  _bufferEnd  = p + _section->_buffer._capacity;
  _bufferPtr  = p + _section->_buffer._length;

  _op4.reset();
  _op5.reset();

  return Base::onAttach(code);
}